

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,bool *i)

{
  long lVar1;
  qint8 *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qint8 v;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  operator>>(in_RDI,in_RSI);
  *in_RSI = '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator>>(bool &i)
{
    qint8 v;
    *this >> v;
    i = !!v;
    return *this;
}